

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool Am_Standard_Selective_New_Allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *param_3)

{
  bool bVar1;
  Am_Value local_58 [2];
  Am_Value local_38;
  Am_Value *local_28;
  Am_Value *param_2_local;
  Am_Value *new_selection_local;
  Am_Object *command_obj_local;
  
  local_28 = param_3;
  param_2_local = new_selection;
  new_selection_local = (Am_Value *)command_obj;
  Am_Value::Am_Value(&local_38,new_selection);
  bVar1 = Am_Valid_and_Visible_List_Or_Object(&local_38,true);
  Am_Value::~Am_Value(&local_38);
  if (bVar1) {
    Am_Value::Am_Value(local_58,new_selection);
    command_obj_local._7_1_ = Am_Check_One_Or_More_For_Inactive_Slot(local_58,command_obj);
    Am_Value::~Am_Value(local_58);
  }
  else {
    command_obj_local._7_1_ = 0;
  }
  return (bool)(command_obj_local._7_1_ & 1);
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 Am_Standard_Selective_New_Allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value /* new_value */))
{
  if (Am_Valid_and_Visible_List_Or_Object(new_selection))
    return Am_Check_One_Or_More_For_Inactive_Slot(new_selection, command_obj);
  else
    return false;
}